

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeakFinder.cpp
# Opt level: O0

void scalarProduct(float scalar,vector<float,_std::allocator<float>_> *in,
                  vector<float,_std::allocator<float>_> *out)

{
  float fVar1;
  float fVar2;
  size_type sVar3;
  reference pvVar4;
  int local_50;
  int i;
  allocator<float> local_39;
  vector<float,_std::allocator<float>_> local_38;
  vector<float,_std::allocator<float>_> *local_20;
  vector<float,_std::allocator<float>_> *out_local;
  vector<float,_std::allocator<float>_> *in_local;
  float scalar_local;
  
  local_20 = out;
  out_local = in;
  in_local._4_4_ = scalar;
  sVar3 = std::vector<float,_std::allocator<float>_>::size(in);
  std::allocator<float>::allocator(&local_39);
  std::vector<float,_std::allocator<float>_>::vector(&local_38,sVar3,&local_39);
  std::vector<float,_std::allocator<float>_>::operator=(local_20,&local_38);
  std::vector<float,_std::allocator<float>_>::~vector(&local_38);
  std::allocator<float>::~allocator(&local_39);
  local_50 = 0;
  while( true ) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size(in);
    fVar2 = in_local._4_4_;
    if (sVar3 <= (ulong)(long)local_50) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](in,(long)local_50);
    fVar1 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](local_20,(long)local_50);
    *pvVar4 = fVar2 * fVar1;
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void scalarProduct(float scalar, std::vector<float> in, std::vector<float>& out)
{
	out = std::vector<float>(in.size());

	for(int i=0; i<in.size(); ++i)
		out[i] = scalar * in[i];
}